

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLogLog>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ImVec2 IVar7;
  int iVar8;
  ImU32 IVar9;
  uint uVar10;
  GetterXsYs<float> *pGVar11;
  TransformerLogLog *pTVar12;
  ImPlotPlot *pIVar13;
  ImDrawVert *pIVar14;
  ImDrawIdx *pIVar15;
  ImPlotContext *pIVar16;
  bool bVar17;
  long lVar18;
  ImDrawIdx IVar19;
  double dVar20;
  double dVar21;
  ImVec2 IVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  pIVar16 = GImPlot;
  pGVar11 = this->Getter;
  pTVar12 = this->Transformer;
  iVar8 = pGVar11->Count;
  lVar18 = (long)(((pGVar11->Offset + prim + 1) % iVar8 + iVar8) % iVar8) * (long)pGVar11->Stride;
  fVar2 = *(float *)((long)pGVar11->Ys + lVar18);
  dVar20 = log10((double)*(float *)((long)pGVar11->Xs + lVar18) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar16->LogDenX;
  pIVar13 = pIVar16->CurrentPlot;
  dVar4 = (pIVar13->XAxis).Range.Min;
  dVar5 = (pIVar13->XAxis).Range.Max;
  dVar21 = log10((double)fVar2 / pIVar13->YAxis[pTVar12->YAxis].Range.Min);
  iVar8 = pTVar12->YAxis;
  pIVar13 = pIVar16->CurrentPlot;
  dVar6 = pIVar13->YAxis[iVar8].Range.Min;
  IVar22.x = (float)((((double)(float)(dVar20 / dVar3) * (dVar5 - dVar4) + dVar4) -
                     (pIVar13->XAxis).Range.Min) * pIVar16->Mx +
                    (double)pIVar16->PixelRange[iVar8].Min.x);
  fVar23 = (float)((((double)(float)(dVar21 / pIVar16->LogDenY[iVar8]) *
                     (pIVar13->YAxis[iVar8].Range.Max - dVar6) + dVar6) - dVar6) *
                   pIVar16->My[iVar8] + (double)pIVar16->PixelRange[iVar8].Min.y);
  fVar2 = (this->P1).x;
  fVar24 = (this->P1).y;
  fVar25 = fVar24;
  if (fVar23 <= fVar24) {
    fVar25 = fVar23;
  }
  bVar17 = false;
  if ((fVar25 < (cull_rect->Max).y) &&
     (fVar24 = (float)(-(uint)(fVar23 <= fVar24) & (uint)fVar24 |
                      ~-(uint)(fVar23 <= fVar24) & (uint)fVar23), pfVar1 = &(cull_rect->Min).y,
     bVar17 = false, *pfVar1 <= fVar24 && fVar24 != *pfVar1)) {
    fVar24 = fVar2;
    if (IVar22.x <= fVar2) {
      fVar24 = IVar22.x;
    }
    if (fVar24 < (cull_rect->Max).x) {
      fVar24 = (float)(~-(uint)(IVar22.x <= fVar2) & (uint)IVar22.x |
                      -(uint)(IVar22.x <= fVar2) & (uint)fVar2);
      bVar17 = (cull_rect->Min).x <= fVar24 && fVar24 != (cull_rect->Min).x;
    }
  }
  if (bVar17 != false) {
    fVar24 = (this->P1).y;
    fVar25 = fVar24 + this->HalfWeight;
    fVar24 = fVar24 - this->HalfWeight;
    IVar9 = this->Col;
    IVar7 = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    (pIVar14->pos).x = fVar2;
    (pIVar14->pos).y = fVar25;
    DrawList->_VtxWritePtr->uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = IVar9;
    pIVar14[1].pos.x = IVar22.x;
    pIVar14[1].pos.y = fVar24;
    DrawList->_VtxWritePtr[1].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = IVar9;
    pIVar14[2].pos.x = fVar2;
    pIVar14[2].pos.y = fVar24;
    pIVar14[2].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = IVar9;
    pIVar14[3].pos.x = IVar22.x;
    pIVar14[3].pos.y = fVar25;
    pIVar14[3].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar14 + 4;
    uVar10 = DrawList->_VtxCurrentIdx;
    pIVar15 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar10;
    *pIVar15 = IVar19;
    pIVar15[1] = IVar19 + 1;
    pIVar15[2] = IVar19 + 2;
    pIVar15[3] = IVar19;
    pIVar15[4] = IVar19 + 1;
    pIVar15[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar15 + 6;
    DrawList->_VtxCurrentIdx = uVar10 + 4;
    fVar25 = IVar22.x - this->HalfWeight;
    fVar24 = this->HalfWeight + IVar22.x;
    fVar2 = (this->P1).y;
    IVar9 = this->Col;
    IVar7 = *uv;
    pIVar14[4].pos.x = fVar25;
    pIVar14[4].pos.y = fVar23;
    DrawList->_VtxWritePtr->uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = IVar9;
    pIVar14[1].pos.x = fVar24;
    pIVar14[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = IVar9;
    pIVar14[2].pos.x = fVar25;
    pIVar14[2].pos.y = fVar2;
    pIVar14[2].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = IVar9;
    pIVar14[3].pos.x = fVar24;
    pIVar14[3].pos.y = fVar23;
    pIVar14[3].uv = IVar7;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar14 + 4;
    uVar10 = DrawList->_VtxCurrentIdx;
    pIVar15 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar10;
    *pIVar15 = IVar19;
    pIVar15[1] = IVar19 + 1;
    pIVar15[2] = IVar19 + 2;
    pIVar15[3] = IVar19;
    pIVar15[4] = IVar19 + 1;
    pIVar15[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar15 + 6;
    DrawList->_VtxCurrentIdx = uVar10 + 4;
  }
  IVar22.y = fVar23;
  this->P1 = IVar22;
  return bVar17;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }